

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItAFunction<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  byte bVar1;
  uint uVar2;
  uint32 uVar3;
  ostream *poVar4;
  ulong uVar5;
  byte *pbVar6;
  byte bVar7;
  uint j;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  _Map_pointer ppuVar13;
  bool bVar14;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  byte local_1841;
  uint32 local_1840;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1838;
  CyclicHash<unsigned_int,_unsigned_char> local_17e0;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar11 = 3;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_17e0,3,L);
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_last = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_cur = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_first = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1838,0);
  do {
    local_1840 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_1840);
    local_1841 = (char)uVar3 + 0x41;
    if (local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1838,&local_1841);
    }
    else {
      *local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1841;
      local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_17e0.hashvalue =
         (local_17e0.hashvalue >> ((char)local_17e0.wordsize - 1U & 0x1f) |
         (local_17e0.mask1 & local_17e0.hashvalue) * 2) ^ local_17e0.hasher.hashvalues[local_1841];
    iVar11 = iVar11 + -1;
  } while (iVar11 != 0);
  bVar14 = false;
  uVar12 = 0;
  while( true ) {
    bVar1 = *local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_1838._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1838._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1838._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1838._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1838._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1838._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1838._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_1840 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_1840);
    bVar7 = (char)uVar3 + 0x41;
    local_1840 = CONCAT71(local_1840._1_7_,bVar7);
    if (local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1838,
                 (uchar *)&local_1840);
    }
    else {
      *local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = bVar7;
      local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    uVar2 = local_17e0.hasher.hashvalues[bVar1];
    local_17e0.hashvalue =
         (uVar2 >> ((char)local_17e0.wordsize - (byte)local_17e0.myr & 0x1f) |
         (local_17e0.maskn & uVar2) << ((byte)local_17e0.myr & 0x1f)) ^
         local_17e0.hasher.hashvalues[bVar7] ^
         (local_17e0.hashvalue >> ((char)local_17e0.wordsize - 1U & 0x1f) |
         (local_17e0.mask1 & local_17e0.hashvalue) * 2);
    uVar2 = CyclicHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_int,unsigned_char> *)&local_17e0,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1838);
    if (uVar2 != local_17e0.hashvalue) break;
    bVar14 = 0x1869e < uVar12;
    uVar12 = uVar12 + 1;
    if (uVar12 == 100000) goto LAB_00104da8;
  }
  pbVar8 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppuVar13 = local_1838._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_last;
  if (local_1838._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    do {
      local_1840 = CONCAT71(local_1840._1_7_,*pbVar8);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_1840,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pbVar8 = pbVar8 + 1;
      if (pbVar8 == pbVar6) {
        pbVar8 = ppuVar13[1];
        ppuVar13 = ppuVar13 + 1;
        pbVar6 = pbVar8 + 0x200;
      }
    } while (pbVar8 != local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"bug",3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  uVar5 = (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_cur -
          (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first;
  pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (0x1ff < uVar5) {
    uVar10 = uVar5 >> 9 | 0xff80000000000000;
    if (0 < (long)uVar5) {
      uVar10 = uVar5 >> 9;
    }
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_node[uVar10] +
             uVar5 + uVar10 * -0x200;
  }
  local_1840._0_1_ = *pbVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_1840,1);
  pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur +
           (1 - (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first);
  if (pbVar6 < (byte *)0x200) {
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
  }
  else {
    uVar5 = (ulong)pbVar6 >> 9 | 0xff80000000000000;
    if (-1 < (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar5 = (ulong)pbVar6 >> 9;
    }
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(pbVar6 + uVar5 * -0x200);
  }
  local_1840._0_1_ = *pbVar6;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1840,1);
  pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur +
           (2 - (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first);
  if (pbVar6 < (byte *)0x200) {
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 2;
  }
  else {
    uVar5 = (ulong)pbVar6 >> 9 | 0xff80000000000000;
    if (-2 < (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_cur -
             (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first) {
      uVar5 = (ulong)pbVar6 >> 9;
    }
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
             (long)(pbVar6 + uVar5 * -0x200);
  }
  local_1840 = CONCAT71(local_1840._1_7_,*pbVar6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_1840,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," was hashed to ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," when true hash value is ",0x19);
  CyclicHash<unsigned_int,unsigned_char>::
  hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
            ((CyclicHash<unsigned_int,unsigned_char> *)&local_17e0,
             (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1838);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar9 = 0;
  do {
    pbVar6 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur +
             (lVar9 - (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first);
    pbVar8 = local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((byte *)0x1ff < pbVar6) {
      uVar5 = (ulong)pbVar6 >> 9 | 0xff80000000000000;
      if (0 < (long)pbVar6) {
        uVar5 = (ulong)pbVar6 >> 9;
      }
      pbVar8 = local_1838._M_impl.super__Deque_impl_data._M_start._M_node[uVar5] +
               (long)(local_1838._M_impl.super__Deque_impl_data._M_start._M_cur +
                     (uVar5 * -0x200 -
                     (long)local_1838._M_impl.super__Deque_impl_data._M_start._M_first));
    }
    local_1840 = CONCAT71(local_1840._1_7_,pbVar8[lVar9]);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)&local_1840,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"->",2);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
LAB_00104da8:
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1838);
  return bVar14;
}

Assistant:

bool isItAFunction(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);

    s.push_back(c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      for (deque<unsigned char>::iterator ii = s.begin(); ii != s.end(); ++ii)
        cout << *ii << " " << static_cast<uint32>(*ii) << endl;
      cerr << "bug" << endl;
      cerr << s[0] << s[1] << s[2] << " was hashed to " << hf.hashvalue
           << " when true hash value is " << hf.hash(s) << endl;
      for (uint j = 0; j < n; ++j)
        cerr << s[j] << "->" << hf.hasher.hashvalues[s[j]] << endl;
      return false;
    }
  }
  return true;
}